

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assembler.cpp
# Opt level: O0

void splitLine(wstring *line,wstring *name,wstring *arguments)

{
  int iVar1;
  int *piVar2;
  wchar_t *pwVar3;
  bool bVar4;
  int local_24;
  int linePos;
  wstring *arguments_local;
  wstring *name_local;
  wstring *line_local;
  
  local_24 = 0;
  std::__cxx11::wstring::operator=((wstring *)name,L"");
  std::__cxx11::wstring::operator=((wstring *)arguments,L"");
  while( true ) {
    iVar1 = std::__cxx11::wstring::size();
    bVar4 = false;
    if (local_24 < iVar1) {
      piVar2 = (int *)std::__cxx11::wstring::operator[]((ulong)line);
      bVar4 = true;
      if (*piVar2 != 0x20) {
        piVar2 = (int *)std::__cxx11::wstring::operator[]((ulong)line);
        bVar4 = *piVar2 == 9;
      }
    }
    if (!bVar4) break;
    local_24 = local_24 + 1;
  }
  while( true ) {
    iVar1 = std::__cxx11::wstring::size();
    bVar4 = false;
    if (local_24 < iVar1) {
      piVar2 = (int *)std::__cxx11::wstring::operator[]((ulong)line);
      bVar4 = *piVar2 != 0x20;
    }
    if (!bVar4) break;
    piVar2 = (int *)std::__cxx11::wstring::operator[]((ulong)line);
    if (*piVar2 == 0) {
      return;
    }
    local_24 = local_24 + 1;
    pwVar3 = (wchar_t *)std::__cxx11::wstring::operator[]((ulong)line);
    std::__cxx11::wstring::operator+=((wstring *)name,*pwVar3);
  }
  while( true ) {
    iVar1 = std::__cxx11::wstring::size();
    bVar4 = false;
    if (local_24 < iVar1) {
      piVar2 = (int *)std::__cxx11::wstring::operator[]((ulong)line);
      bVar4 = true;
      if (*piVar2 != 0x20) {
        piVar2 = (int *)std::__cxx11::wstring::operator[]((ulong)line);
        bVar4 = *piVar2 == 9;
      }
    }
    if (!bVar4) break;
    local_24 = local_24 + 1;
  }
  while( true ) {
    iVar1 = std::__cxx11::wstring::size();
    bVar4 = false;
    if (local_24 < iVar1) {
      piVar2 = (int *)std::__cxx11::wstring::operator[]((ulong)line);
      bVar4 = *piVar2 != 0;
    }
    if (!bVar4) break;
    local_24 = local_24 + 1;
    pwVar3 = (wchar_t *)std::__cxx11::wstring::operator[]((ulong)line);
    std::__cxx11::wstring::operator+=((wstring *)arguments,*pwVar3);
  }
  return;
}

Assistant:

void splitLine(std::wstring& line, std::wstring& name, std::wstring& arguments)
{
	int linePos = 0;
	name = L"";
	arguments = L"";

	while (linePos < (int)line.size() && (line[linePos] == ' ' || line[linePos] == '\t')) linePos++;
	while (linePos < (int)line.size() && line[linePos] != ' ')
	{
		if (line[linePos]  == 0)
		{
			return;
		}
		name += line[linePos++];
	}
	
	while (linePos < (int)line.size() && (line[linePos] == ' ' || line[linePos] == '\t')) linePos++;

	while (linePos < (int)line.size() && line[linePos] != 0)
	{
		arguments += line[linePos++];
	}
}